

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type __thiscall
cm::String::replace<std::basic_string_view<char,std::char_traits<char>>>
          (String *this,size_type pos,size_type count,
          basic_string_view<char,_std::char_traits<char>_> *s,size_type pos2,size_type count2)

{
  type pSVar1;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30 = *s;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_30,pos2,count2);
  pSVar1 = replace<std::basic_string_view<char,std::char_traits<char>>&>(this,pos,count,&local_30);
  return pSVar1;
}

Assistant:

typename std::enable_if<AsStringView<T>::value, String&>::type replace(
    size_type pos, size_type count, T&& s, size_type pos2,
    size_type count2 = npos)
  {
    string_view v = AsStringView<T>::view(std::forward<T>(s));
    v = v.substr(pos2, count2);
    return replace(pos, count, v);
  }